

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkGetStepStats(void *arkode_mem,long *nsteps,realtype *hinused,realtype *hlast,realtype *hcur,
                   realtype *tcur)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetStepStats","arkode_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)((long)arkode_mem + 0x1d8);
    *hinused = *(realtype *)((long)arkode_mem + 0x228);
    *hlast = *(realtype *)((long)arkode_mem + 0x238);
    *hcur = *(realtype *)((long)arkode_mem + 0x188);
    *tcur = *(realtype *)((long)arkode_mem + 0x198);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkGetStepStats(void *arkode_mem, long int *nsteps,
                    realtype *hinused, realtype *hlast,
                    realtype *hcur, realtype *tcur)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetStepStats", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  *nsteps  = ark_mem->nst;
  *hinused = ark_mem->h0u;
  *hlast   = ark_mem->hold;
  *hcur    = ark_mem->next_h;
  *tcur    = ark_mem->tcur;
  return(ARK_SUCCESS);
}